

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_mov64FromMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,
               sysbvm_x86_register_t source,int32_t offset)

{
  uint8_t reg;
  uint8_t regOpcode;
  uint8_t local_32 [3];
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  uint8_t local_2b;
  uint8_t instruction_3 [7];
  uint8_t instruction_2 [8];
  uint8_t instruction_1 [3];
  uint8_t instruction [4];
  int32_t offset_local;
  sysbvm_x86_register_t source_local;
  sysbvm_x86_register_t destination_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  reg = (uint8_t)source;
  regOpcode = (uint8_t)destination;
  unique0x10000199 = offset;
  if ((offset == 0) && (source != SYSBVM_X86_EBP)) {
    if ((source & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      instruction_2[3] =
           sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < destination,false,
                              SYSBVM_X86_64_ARG0 < source);
      instruction_2[4] = 0x8b;
      instruction_2[5] = sysbvm_jit_x86_modRM(reg,regOpcode,'\0');
      instruction_2[6] = sysbvm_jit_x86_sibOnlyBase(reg);
      sysbvm_bytecodeJit_addBytes(jit,4,instruction_2 + 3);
    }
    else {
      instruction_2[0] =
           sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < destination,false,
                              SYSBVM_X86_64_ARG0 < source);
      instruction_2[1] = 0x8b;
      instruction_2[2] = sysbvm_jit_x86_modRM(reg,regOpcode,'\0');
      sysbvm_bytecodeJit_addBytes(jit,3,instruction_2);
    }
  }
  else if ((source & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
    local_2b = sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < destination,false,
                                  SYSBVM_X86_64_ARG0 < source);
    instruction_3[0] = 0x8b;
    instruction_3[1] = sysbvm_jit_x86_modRM(reg,regOpcode,'\x02');
    instruction_3[2] = sysbvm_jit_x86_sibOnlyBase(reg);
    instruction_3[3] = (uint8_t)stack0xffffffffffffffe4;
    instruction_3[4] = (uint8_t)((uint)stack0xffffffffffffffe4 >> 8);
    instruction_3[5] = (uint8_t)((uint)stack0xffffffffffffffe4 >> 0x10);
    instruction_3[6] = (uint8_t)((uint)stack0xffffffffffffffe4 >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,8,&local_2b);
  }
  else {
    local_32[0] = sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < destination,false,
                                     SYSBVM_X86_64_ARG0 < source);
    local_32[1] = 0x8b;
    local_32[2] = sysbvm_jit_x86_modRM(reg,regOpcode,'\x02');
    local_2f = (undefined1)stack0xffffffffffffffe4;
    local_2e = (undefined1)((uint)stack0xffffffffffffffe4 >> 8);
    local_2d = (undefined1)((uint)stack0xffffffffffffffe4 >> 0x10);
    local_2c = (undefined1)((uint)stack0xffffffffffffffe4 >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,7,local_32);
  }
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64FromMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, sysbvm_x86_register_t source, int32_t offset)
{
    if(offset == 0 && source != SYSBVM_X86_RBP)
    {
        if((source & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 0),
                sysbvm_jit_x86_sibOnlyBase(source),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
    else
    {
        if((source & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 2),
                sysbvm_jit_x86_sibOnlyBase(source),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}